

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_math.c
# Opt level: O2

int lj_cf_math_random(lua_State *L)

{
  RandomState *rs;
  TValue *pTVar1;
  TValue *pTVar2;
  ulong uVar3;
  double dVar4;
  int iVar5;
  lua_Number lVar6;
  lua_Number lVar7;
  lua_Number lVar8;
  
  pTVar1 = L->base;
  pTVar2 = L->top;
  uVar3 = (ulong)*(uint *)((ulong)pTVar1[-1].u32.lo + 0x20);
  rs = (RandomState *)(uVar3 + 0x18);
  if (*(int *)(uVar3 + 0x38) == 0) {
    random_init(rs,0.0);
  }
  dVar4 = (double)lj_math_random_step(rs);
  lVar6 = dVar4 + -1.0;
  iVar5 = (int)((ulong)((long)pTVar2 - (long)pTVar1) >> 3);
  if (0 < iVar5) {
    lVar7 = lj_lib_checknum(L,1);
    if (iVar5 == 1) {
      dVar4 = floor(lVar6 * lVar7);
      lVar6 = dVar4 + 1.0;
    }
    else {
      lVar8 = lj_lib_checknum(L,2);
      dVar4 = floor(((lVar8 - lVar7) + 1.0) * lVar6);
      lVar6 = dVar4 + lVar7;
    }
  }
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->n = lVar6;
  return 1;
}

Assistant:

LJLIB_CF(math_random)		LJLIB_REC(.)
{
  int n = (int)(L->top - L->base);
  RandomState *rs = (RandomState *)(uddata(udataV(lj_lib_upvalue(L, 1))));
  U64double u;
  double d;
  if (LJ_UNLIKELY(!rs->valid)) random_init(rs, 0.0);
  u.u64 = lj_math_random_step(rs);
  d = u.d - 1.0;
  if (n > 0) {
#if LJ_DUALNUM
    int isint = 1;
    double r1;
    lj_lib_checknumber(L, 1);
    if (tvisint(L->base)) {
      r1 = (lua_Number)intV(L->base);
    } else {
      isint = 0;
      r1 = numV(L->base);
    }
#else
    double r1 = lj_lib_checknum(L, 1);
#endif
    if (n == 1) {
      d = lj_vm_floor(d*r1) + 1.0;  /* d is an int in range [1, r1] */
    } else {
#if LJ_DUALNUM
      double r2;
      lj_lib_checknumber(L, 2);
      if (tvisint(L->base+1)) {
	r2 = (lua_Number)intV(L->base+1);
      } else {
	isint = 0;
	r2 = numV(L->base+1);
      }
#else
      double r2 = lj_lib_checknum(L, 2);
#endif
      d = lj_vm_floor(d*(r2-r1+1.0)) + r1;  /* d is an int in range [r1, r2] */
    }
#if LJ_DUALNUM
    if (isint) {
      setintV(L->top-1, lj_num2int(d));
      return 1;
    }
#endif
  }  /* else: d is a double in range [0, 1] */
  setnumV(L->top++, d);
  return 1;
}